

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O0

void __thiscall Blob_Detection::BlobInfo::_getElongation(BlobInfo *this)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  reference pdVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  ulong uVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  double dVar6;
  undefined1 extraout_var_01 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM3 [64];
  double height;
  const_iterator endRotated;
  iterator yRotated;
  const_iterator xRotated;
  vector<double,_std::allocator<double>_> contourYTemp;
  double _sin;
  double _cos;
  double angle;
  double length;
  PointBase2D<unsigned_int> endPoint;
  PointBase2D<unsigned_int> startPoint;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_fffffffffffffec0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffed0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed8;
  allocator_type *in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint _x;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first_00;
  PointBase2D<unsigned_int> *in_stack_ffffffffffffff18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c8;
  double *local_c0;
  double *local_b8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  double local_a8;
  uint *local_a0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  uint *local_88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80 [4];
  uint *local_60;
  uint *local_58;
  double local_50 [3];
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  PointBase2D<unsigned_int> local_18;
  PointBase2D<unsigned_int> local_10 [2];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar11 = in_ZMM1._0_16_;
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(in_stack_fffffffffffffed0)
  ;
  if (!bVar1) {
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      (in_stack_fffffffffffffed0);
    if ((!bVar1) &&
       (((ulong)in_RDI[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start & 1) == 0)) {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI + 2);
      if (sVar2 < 2) {
        in_RDI[8].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
      }
      else {
        __first_00._M_current = &local_10[0].x;
        _x = 0;
        PointBase2D<unsigned_int>::PointBase2D
                  ((PointBase2D<unsigned_int> *)__first_00._M_current,0,0);
        PointBase2D<unsigned_int>::PointBase2D(&local_18,_x,_x);
        auVar8._0_8_ = anon_unknown.dwarf_c5d8::getLengthFromCountour
                                 (in_stack_ffffffffffffff28,in_RDI,in_stack_ffffffffffffff18,
                                  (PointBase2D<unsigned_int> *)(in_RDI + 3));
        auVar8._8_56_ = extraout_var;
        auVar13 = vcvtusi2sd_avx512f(auVar8._0_16_,local_18.y - local_10[0].y);
        auVar11 = vcvtusi2sd_avx512f(auVar11,local_18.x - local_10[0].x);
        local_20 = auVar8._0_8_;
        auVar9._0_8_ = atan2(auVar13._0_8_,auVar11._0_8_);
        auVar9._8_56_ = extraout_var_00;
        auVar11._8_8_ = 0x8000000000000000;
        auVar11._0_8_ = 0x8000000000000000;
        local_28 = (double)vmovlpd_avx(auVar9._0_16_ ^ auVar11);
        local_30 = cos(local_28);
        auVar10._0_8_ = sin(local_28);
        auVar10._8_56_ = extraout_var_01;
        local_38 = auVar10._0_8_;
        local_58 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffffeb8);
        local_60 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffffeb8);
        std::allocator<double>::allocator((allocator<double> *)0x106ed7);
        __last._M_current._4_4_ = _x;
        __last._M_current._0_4_ = in_stack_fffffffffffffef8;
        std::vector<double,std::allocator<double>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  (in_stack_fffffffffffffef0,__first_00,__last,in_stack_fffffffffffffee8);
        std::allocator<double>::~allocator((allocator<double> *)0x106f08);
        local_88 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffffeb8);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  (in_stack_fffffffffffffec0,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    *)in_stack_fffffffffffffeb8);
        local_90._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
        local_a0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffffeb8);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  (in_stack_fffffffffffffec0,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    *)in_stack_fffffffffffffeb8);
        while( true ) {
          auVar11 = auVar10._0_16_;
          auVar13 = in_ZMM3._0_16_;
          bVar1 = __gnu_cxx::operator!=
                            (in_stack_fffffffffffffec0,
                             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_fffffffffffffeb8);
          if (!bVar1) break;
          puVar3 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(local_80);
          dVar6 = local_38;
          auVar11 = vcvtusi2sd_avx512f(auVar11,*puVar3 - local_10[0].x);
          uVar5 = auVar11._0_8_;
          pdVar4 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_90);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = dVar6;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar5;
          auVar11 = vcvtusi2sd_avx512f(auVar13,local_10[0].y);
          in_ZMM3 = ZEXT1664(auVar11);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = (*pdVar4 - auVar11._0_8_) * local_30;
          auVar11 = vfmadd213sd_fma(auVar7,auVar12,auVar13);
          dVar6 = auVar11._0_8_;
          pdVar4 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_90);
          auVar10 = ZEXT864((ulong)dVar6);
          *pdVar4 = dVar6;
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(local_80);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator++(&local_90);
        }
        __last_00._M_current = local_50;
        local_b8 = (double *)
                   std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
        local_c0 = (double *)
                   std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffeb8);
        __first = std::
                  max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (in_stack_fffffffffffffed8,__last_00);
        local_b0 = __first;
        pdVar4 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_b0);
        this_00 = (vector<double,_std::allocator<double>_> *)*pdVar4;
        std::vector<double,_std::allocator<double>_>::begin(this_00);
        std::vector<double,_std::allocator<double>_>::end(this_00);
        local_c8 = std::
                   min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                             (__first,__last_00);
        pdVar4 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_c8);
        local_a8 = (double)this_00 - *pdVar4;
        if (local_a8 < 1.0) {
          local_a8 = 1.0;
        }
        in_RDI[8].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(local_20 / local_a8);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)__last_00._M_current);
      }
      *(undefined1 *)
       &in_RDI[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = 1;
    }
  }
  return;
}

Assistant:

void BlobInfo::_getElongation()
    {
        if( !_contourX.empty() && !_contourY.empty() && !_elongation.found ) {
            if( _contourX.size() > 1 ) {
                PointBase2D< uint32_t > startPoint;
                PointBase2D< uint32_t > endPoint;
                const double length = getLengthFromCountour( _contourX, _contourY, startPoint, endPoint );
                const double angle = -atan2( static_cast<double>(endPoint.y - startPoint.y),
                                             static_cast<double>(endPoint.x - startPoint.x) );

                const double _cos = cos( angle );
                const double _sin = sin( angle );

                std::vector < double > contourYTemp( _contourY.begin(), _contourY.end() );

                std::vector < uint32_t >::const_iterator xRotated   = _contourX.begin();
                std::vector < double >::iterator yRotated           = contourYTemp.begin();
                std::vector < uint32_t >::const_iterator endRotated = _contourX.end();

                for( ; xRotated != endRotated; ++xRotated, ++yRotated )
                    (*yRotated) = (*xRotated - startPoint.x) * _sin + (*yRotated - startPoint.y) * _cos;

                double height = *(std::max_element( contourYTemp.begin(), contourYTemp.end() )) -
                    *(std::min_element( contourYTemp.begin(), contourYTemp.end() ));

                if( height < 1 )
                    height = 1;

                _elongation.value = length / height;
            }
            else {
                _elongation.value = 1;
            }

            _elongation.found = true;
        }
    }